

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

void rtr_mgr_cb(rtr_socket *sock,rtr_socket_state state,void *data_config,void *data_group)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_mgr_group *group;
  rtr_mgr_config *config;
  void *data_group_local;
  void *data_config_local;
  rtr_socket_state state_local;
  rtr_socket *sock_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (state == RTR_SHUTDOWN) {
    lrtr_dbg("RTR_MGR: Received RTR_SHUTDOWN callback");
  }
  if (data_group == (void *)0x0) {
    lrtr_dbg("RTR_MGR: ERROR: Socket has no group");
  }
  else {
    switch(state) {
    case RTR_CONNECTING:
      _rtr_mgr_cb_state_connecting(sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
      break;
    case RTR_ESTABLISHED:
      _rtr_mgr_cb_state_established(sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
      break;
    default:
      set_status((rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group,
                 *(rtr_mgr_status *)((long)data_group + 0x10),sock);
      break;
    case RTR_ERROR_NO_DATA_AVAIL:
    case RTR_ERROR_FATAL:
    case RTR_ERROR_TRANSPORT:
      _rtr_mgr_cb_state_error(sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
      break;
    case RTR_SHUTDOWN:
      _rtr_mgr_cb_state_shutdown(sock,(rtr_mgr_config *)data_config,(rtr_mgr_group *)data_group);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtr_mgr_cb(const struct rtr_socket *sock, const enum rtr_socket_state state, void *data_config,
		       void *data_group)
{
	if (state == RTR_SHUTDOWN)
		MGR_DBG1("Received RTR_SHUTDOWN callback");

	struct rtr_mgr_config *config = data_config;
	struct rtr_mgr_group *group = data_group;

	if (!group) {
		MGR_DBG1("ERROR: Socket has no group");
		return;
	}

	switch (state) {
	case RTR_SHUTDOWN:
		_rtr_mgr_cb_state_shutdown(sock, config, group);
		break;
	case RTR_ESTABLISHED:
		_rtr_mgr_cb_state_established(sock, config, group);
		break;
	case RTR_CONNECTING:
		_rtr_mgr_cb_state_connecting(sock, config, group);
		break;
	case RTR_ERROR_FATAL:
	case RTR_ERROR_TRANSPORT:
	case RTR_ERROR_NO_DATA_AVAIL:
		_rtr_mgr_cb_state_error(sock, config, group);
		break;
	default:
		set_status(config, group, group->status, sock);
	}
}